

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::keyboardSearchString(QComboBoxPrivate *this,QString *text)

{
  int iVar1;
  int iVar2;
  QComboBoxPrivateContainer *this_00;
  QModelIndex *pQVar3;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  int currentRow;
  QAbstractItemView *view;
  QModelIndex *index;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar4;
  QPersistentModelIndex in_stack_ffffffffffffff80;
  QComboBoxPrivate *in_stack_ffffffffffffff88;
  QModelIndex local_50;
  QComboBoxPrivate *in_stack_ffffffffffffffc8;
  QPersistentModelIndex local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = viewContainer(in_stack_ffffffffffffffc8);
  pQVar3 = (QModelIndex *)QComboBoxPrivateContainer::itemView(this_00);
  index = pQVar3;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_20);
  QAbstractItemView::setCurrentIndex
            ((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             index);
  QAbstractItemView::currentIndex
            ((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  iVar1 = QModelIndex::row((QModelIndex *)&stack0xffffffffffffffc8);
  (**(code **)(*(long *)pQVar3 + 0x1d8))(pQVar3,in_RSI);
  iVar4 = iVar1;
  QAbstractItemView::currentIndex((QAbstractItemView *)CONCAT44(iVar1,iVar1));
  iVar2 = QModelIndex::row(&local_50);
  if (iVar1 != iVar2) {
    QAbstractItemView::currentIndex((QAbstractItemView *)CONCAT44(iVar4,iVar1));
    setCurrentIndex(in_stack_ffffffffffffff88,(QModelIndex *)in_stack_ffffffffffffff80.d);
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QPersistentModelIndex *)&stack0xffffffffffffff80);
    emitActivated((QComboBoxPrivate *)CONCAT44(iVar4,iVar1),index);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::keyboardSearchString(const QString &text)
{
    // use keyboardSearch from the listView so we do not duplicate code
    QAbstractItemView *view = viewContainer()->itemView();
    view->setCurrentIndex(currentIndex);
    int currentRow = view->currentIndex().row();
    view->keyboardSearch(text);
    if (currentRow != view->currentIndex().row()) {
        setCurrentIndex(view->currentIndex());
        emitActivated(currentIndex);
    }
}